

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

void __thiscall
ghc::filesystem::path::input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
          (input_iterator_range<ghc::filesystem::path::iterator> *this,iterator *first,
          iterator *last)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  
  (this->_first)._iter._M_current = (first->_iter)._M_current;
  uVar2 = *(undefined4 *)&(first->_first)._M_current;
  uVar3 = *(undefined4 *)((long)&(first->_first)._M_current + 4);
  uVar4 = *(undefined4 *)&(first->_last)._M_current;
  uVar5 = *(undefined4 *)((long)&(first->_last)._M_current + 4);
  uVar6 = *(undefined4 *)((long)&(first->_prefix)._M_current + 4);
  uVar7 = *(undefined4 *)&(first->_root)._M_current;
  uVar8 = *(undefined4 *)((long)&(first->_root)._M_current + 4);
  *(undefined4 *)&(this->_first)._prefix._M_current = *(undefined4 *)&(first->_prefix)._M_current;
  *(undefined4 *)((long)&(this->_first)._prefix._M_current + 4) = uVar6;
  *(undefined4 *)&(this->_first)._root._M_current = uVar7;
  *(undefined4 *)((long)&(this->_first)._root._M_current + 4) = uVar8;
  *(undefined4 *)&(this->_first)._first._M_current = uVar2;
  *(undefined4 *)((long)&(this->_first)._first._M_current + 4) = uVar3;
  *(undefined4 *)&(this->_first)._last._M_current = uVar4;
  *(undefined4 *)((long)&(this->_first)._last._M_current + 4) = uVar5;
  (this->_first)._current._path._M_dataplus._M_p = (pointer)&(this->_first)._current._path.field_2;
  pcVar1 = (first->_current)._path._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->_first)._current,pcVar1,
             pcVar1 + (first->_current)._path._M_string_length);
  (this->_last)._iter._M_current = (last->_iter)._M_current;
  uVar2 = *(undefined4 *)&(last->_first)._M_current;
  uVar3 = *(undefined4 *)((long)&(last->_first)._M_current + 4);
  uVar4 = *(undefined4 *)&(last->_last)._M_current;
  uVar5 = *(undefined4 *)((long)&(last->_last)._M_current + 4);
  uVar6 = *(undefined4 *)((long)&(last->_prefix)._M_current + 4);
  uVar7 = *(undefined4 *)&(last->_root)._M_current;
  uVar8 = *(undefined4 *)((long)&(last->_root)._M_current + 4);
  *(undefined4 *)&(this->_last)._prefix._M_current = *(undefined4 *)&(last->_prefix)._M_current;
  *(undefined4 *)((long)&(this->_last)._prefix._M_current + 4) = uVar6;
  *(undefined4 *)&(this->_last)._root._M_current = uVar7;
  *(undefined4 *)((long)&(this->_last)._root._M_current + 4) = uVar8;
  *(undefined4 *)&(this->_last)._first._M_current = uVar2;
  *(undefined4 *)((long)&(this->_last)._first._M_current + 4) = uVar3;
  *(undefined4 *)&(this->_last)._last._M_current = uVar4;
  *(undefined4 *)((long)&(this->_last)._last._M_current + 4) = uVar5;
  (this->_last)._current._path._M_dataplus._M_p = (pointer)&(this->_last)._current._path.field_2;
  pcVar1 = (last->_current)._path._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->_last)._current,pcVar1,
             pcVar1 + (last->_current)._path._M_string_length);
  return;
}

Assistant:

input_iterator_range(const InputIterator& first, const InputIterator& last)
            : _first(first)
            , _last(last)
        {
        }